

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O0

bool anon_unknown.dwarf_41e4::deserialization_test(char *data,size_t size)

{
  _Bool _Var1;
  int iVar2;
  roaring64_bitmap_t *r;
  uint64_t uVar3;
  roaring64_bitmap_t *in_RSI;
  uint32_t new_cardinality;
  uint32_t i;
  uint32_t cardinality;
  char *reason_failure;
  roaring64_bitmap_t *bitmap;
  roaring64_bitmap_t *in_stack_00000060;
  roaring64_bitmap_t *in_stack_00000070;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar4;
  undefined4 in_stack_ffffffffffffffd4;
  uint64_t uVar5;
  
  r = roaring64_bitmap_portable_deserialize_safe((char *)bitmap,(size_t)reason_failure);
  if (r != (roaring64_bitmap_t *)0x0) {
    uVar5 = 0;
    _Var1 = roaring64_bitmap_internal_validate
                      ((roaring64_bitmap_t *)
                       CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       (char **)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    if (_Var1) {
      uVar3 = roaring64_bitmap_get_cardinality(in_stack_00000070);
      iVar2 = (int)uVar3;
      for (uVar4 = 100; uVar4 < 1000; uVar4 = uVar4 + 1) {
        _Var1 = roaring64_bitmap_contains(in_RSI,(uint64_t)r);
        if (!_Var1) {
          iVar2 = iVar2 + 1;
          roaring64_bitmap_add(r,uVar5);
        }
      }
      uVar5 = roaring64_bitmap_get_cardinality(in_stack_00000070);
      if (iVar2 != (int)uVar5) {
        return false;
      }
    }
    roaring64_bitmap_free(in_stack_00000060);
  }
  return true;
}

Assistant:

bool deserialization_test(const char* data, size_t size) {
    // We test that deserialization never fails.
    roaring64_bitmap_t* bitmap =
        roaring64_bitmap_portable_deserialize_safe(data, size);
    if (bitmap) {
        // The bitmap may not be usable if it does not follow the specification.
        // We can validate the bitmap we recovered to make sure it is proper.
        const char* reason_failure = NULL;
        if (roaring64_bitmap_internal_validate(bitmap, &reason_failure)) {
            // the bitmap is ok!
            uint32_t cardinality = roaring64_bitmap_get_cardinality(bitmap);

            for (uint32_t i = 100; i < 1000; i++) {
                if (!roaring64_bitmap_contains(bitmap, i)) {
                    cardinality++;
                    roaring64_bitmap_add(bitmap, i);
                }
            }

            uint32_t new_cardinality = roaring64_bitmap_get_cardinality(bitmap);
            if (cardinality != new_cardinality) {
                return false;
            }
        }
        roaring64_bitmap_free(bitmap);
    }
    return true;
}